

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void DivisionHelper<unsigned_long_long,long_long,1>::
     DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_long_long *t,longlong *u,unsigned_long_long *result)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = *u;
  if (uVar1 == 0) {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  uVar2 = *t;
  if (uVar2 != 0) {
    if (0 < (long)uVar1) {
      uVar2 = uVar2 / uVar1;
      goto LAB_00122e3c;
    }
    if (-1 < (long)uVar1) {
      __assert_fail("t < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                    ,0x2d8,
                    "static std::uint64_t AbsValueHelper<long long, 1>::Abs(T) [T = long long]");
    }
    if (-uVar1 <= uVar2) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
  }
  uVar2 = 0;
LAB_00122e3c:
  *result = uVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }